

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O1

void __thiscall
vkt::sr::anon_unknown_0::ShaderTextureFunctionInstance::ShaderTextureFunctionInstance
          (ShaderTextureFunctionInstance *this,Context *context,bool isVertexCase,
          ShaderEvaluator *evaluator,UniformSetup *uniformSetup,TextureLookupSpec *lookupSpec,
          TextureSpec *textureSpec,TexLookupParams *lookupParams,ImageBackingMode imageBackingMode)

{
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *this_00;
  Function FVar1;
  TextureLookupSpec *pTVar2;
  int row_3;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  Vector<float,_4> *__args;
  Vec3 sy;
  Vec3 sx;
  Matrix<float,_4,_4> local_e8;
  Vec4 s;
  float baseCoordTrans [16];
  
  ShaderRenderCaseInstance::ShaderRenderCaseInstance
            (&this->super_ShaderRenderCaseInstance,context,isVertexCase,evaluator,uniformSetup,
             (AttributeSetupFunc)0x0,imageBackingMode,0);
  (this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__ShaderRenderCaseInstance_00d5bff8;
  this->m_lookupSpec = lookupSpec;
  this->m_textureSpec = textureSpec;
  this->m_lookupParams = lookupParams;
  checkDeviceFeatures((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context,
                      textureSpec->type);
  pTVar2 = this->m_lookupSpec;
  s.m_data[0] = 0.0;
  s.m_data[1] = 0.0;
  s.m_data[2] = 0.0;
  s.m_data[3] = 0.0;
  lVar5 = 0;
  do {
    s.m_data[lVar5] = (pTVar2->maxCoord).m_data[lVar5] - (pTVar2->minCoord).m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  pfVar3 = baseCoordTrans;
  baseCoordTrans[0] = s.m_data[0];
  baseCoordTrans[1] = 0.0;
  baseCoordTrans[2] = 0.0;
  baseCoordTrans[3] = (pTVar2->minCoord).m_data[0];
  lVar5 = 0;
  baseCoordTrans._16_8_ = s.m_data._0_8_ & 0xffffffff00000000;
  baseCoordTrans._24_8_ = (ulong)(uint)(pTVar2->minCoord).m_data[1] << 0x20;
  baseCoordTrans[9] = s.m_data[2] * -0.5;
  baseCoordTrans[8] = s.m_data[2] * 0.5;
  baseCoordTrans._40_8_ = (ulong)(uint)((pTVar2->minCoord).m_data[2] + s.m_data[2] * 0.5) << 0x20;
  baseCoordTrans[0xd] = s.m_data[3] * 0.5;
  baseCoordTrans[0xc] = s.m_data[3] * -0.5;
  baseCoordTrans._56_8_ = (ulong)(uint)(s.m_data[3] * 0.5 + (pTVar2->minCoord).m_data[3]) << 0x20;
  pfVar4 = (float *)&local_e8;
  local_e8.m_data.m_data[3].m_data[0] = 0.0;
  local_e8.m_data.m_data[3].m_data[1] = 0.0;
  local_e8.m_data.m_data[3].m_data[2] = 0.0;
  local_e8.m_data.m_data[3].m_data[3] = 0.0;
  local_e8.m_data.m_data[2].m_data[0] = 0.0;
  local_e8.m_data.m_data[2].m_data[1] = 0.0;
  local_e8.m_data.m_data[2].m_data[2] = 0.0;
  local_e8.m_data.m_data[2].m_data[3] = 0.0;
  local_e8.m_data.m_data[1].m_data[0] = 0.0;
  local_e8.m_data.m_data[1].m_data[1] = 0.0;
  local_e8.m_data.m_data[1].m_data[2] = 0.0;
  local_e8.m_data.m_data[1].m_data[3] = 0.0;
  local_e8.m_data.m_data[0].m_data[0] = 0.0;
  local_e8.m_data.m_data[0].m_data[1] = 0.0;
  local_e8.m_data.m_data[0].m_data[2] = 0.0;
  local_e8.m_data.m_data[0].m_data[3] = 0.0;
  do {
    lVar6 = 0;
    do {
      pfVar4[lVar6] = (float)*(undefined4 *)((long)pfVar3 + lVar6);
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x10);
    lVar5 = lVar5 + 1;
    pfVar3 = pfVar3 + 4;
    pfVar4 = pfVar4 + 1;
  } while (lVar5 != 4);
  this_00 = &(this->super_ShaderRenderCaseInstance).m_userAttribTransforms;
  __args = (Vector<float,_4> *)&local_e8;
  std::vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>>::
  emplace_back<tcu::Matrix<float,4,4>>
            ((vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>> *)this_00,
             (Matrix<float,_4,_4> *)__args);
  ShaderRenderCaseInstance::useAttribute(&this->super_ShaderRenderCaseInstance,4,A_IN0);
  pTVar2 = this->m_lookupSpec;
  FVar1 = pTVar2->function;
  if (((FVar1 - FUNCTION_TEXTURELOD < 4) || (FVar1 == FUNCTION_TEXELFETCH)) ||
     (pTVar2->useBias == true)) {
    pfVar3 = baseCoordTrans;
    baseCoordTrans[2] = 0.0;
    baseCoordTrans[0xc] = 0.0;
    baseCoordTrans[0xd] = 0.0;
    baseCoordTrans[0xe] = 0.0;
    baseCoordTrans[0xf] = 0.0;
    baseCoordTrans[8] = 0.0;
    baseCoordTrans[9] = 0.0;
    baseCoordTrans[10] = 0.0;
    baseCoordTrans[0xb] = 0.0;
    baseCoordTrans[4] = 0.0;
    baseCoordTrans[5] = 0.0;
    baseCoordTrans[6] = 0.0;
    baseCoordTrans[7] = 0.0;
    baseCoordTrans[0] = (pTVar2->maxLodBias - pTVar2->minLodBias) * 0.5;
    baseCoordTrans[1] = baseCoordTrans[0];
    baseCoordTrans[3] = pTVar2->minLodBias;
    pfVar4 = (float *)&local_e8;
    local_e8.m_data.m_data[3].m_data[0] = 0.0;
    local_e8.m_data.m_data[3].m_data[1] = 0.0;
    local_e8.m_data.m_data[3].m_data[2] = 0.0;
    local_e8.m_data.m_data[3].m_data[3] = 0.0;
    local_e8.m_data.m_data[2].m_data[0] = 0.0;
    local_e8.m_data.m_data[2].m_data[1] = 0.0;
    local_e8.m_data.m_data[2].m_data[2] = 0.0;
    local_e8.m_data.m_data[2].m_data[3] = 0.0;
    local_e8.m_data.m_data[1].m_data[0] = 0.0;
    local_e8.m_data.m_data[1].m_data[1] = 0.0;
    local_e8.m_data.m_data[1].m_data[2] = 0.0;
    local_e8.m_data.m_data[1].m_data[3] = 0.0;
    local_e8.m_data.m_data[0].m_data[0] = 0.0;
    local_e8.m_data.m_data[0].m_data[1] = 0.0;
    local_e8.m_data.m_data[0].m_data[2] = 0.0;
    local_e8.m_data.m_data[0].m_data[3] = 0.0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        pfVar4[lVar6] = (float)*(undefined4 *)((long)pfVar3 + lVar6);
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0x10);
      lVar5 = lVar5 + 1;
      pfVar3 = pfVar3 + 4;
      pfVar4 = pfVar4 + 1;
    } while (lVar5 != 4);
    std::vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>>::
    emplace_back<tcu::Matrix<float,4,4>>
              ((vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>> *)this_00,
               &local_e8);
    ShaderRenderCaseInstance::useAttribute(&this->super_ShaderRenderCaseInstance,5,A_IN1);
  }
  else if ((FVar1 & ~FUNCTION_TEXTUREPROJ3) == FUNCTION_TEXTUREGRAD) {
    sx.m_data[2] = 0.0;
    sx.m_data[0] = 0.0;
    sx.m_data[1] = 0.0;
    lVar5 = 0;
    do {
      sx.m_data[lVar5] = (pTVar2->maxDX).m_data[lVar5] - (pTVar2->minDX).m_data[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    sy.m_data[2] = 0.0;
    sy.m_data[0] = 0.0;
    sy.m_data[1] = 0.0;
    lVar5 = 0;
    do {
      sy.m_data[lVar5] = (pTVar2->maxDY).m_data[lVar5] - (pTVar2->minDY).m_data[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    pfVar3 = baseCoordTrans;
    baseCoordTrans[0] = sx.m_data[0] * 0.5;
    baseCoordTrans[1] = sx.m_data[0] * 0.5;
    lVar5 = 0;
    baseCoordTrans[2] = 0.0;
    baseCoordTrans[3] = (pTVar2->minDX).m_data[0];
    baseCoordTrans[5] = sx.m_data[1] * 0.5;
    baseCoordTrans[4] = sx.m_data[1] * 0.5;
    baseCoordTrans._24_8_ = (ulong)(uint)(pTVar2->minDX).m_data[1] << 0x20;
    baseCoordTrans[9] = sx.m_data[2] * 0.5;
    baseCoordTrans[8] = sx.m_data[2] * 0.5;
    baseCoordTrans._40_8_ = (ulong)(uint)(pTVar2->minDX).m_data[2] << 0x20;
    baseCoordTrans[0xc] = 0.0;
    baseCoordTrans[0xd] = 0.0;
    baseCoordTrans[0xe] = 0.0;
    baseCoordTrans[0xf] = 0.0;
    local_e8.m_data.m_data[0].m_data[1] = sy.m_data[0] * -0.5;
    local_e8.m_data.m_data[0].m_data[0] = sy.m_data[0] * -0.5;
    local_e8.m_data.m_data[0].m_data._8_8_ = (ulong)(uint)(pTVar2->maxDY).m_data[0] << 0x20;
    local_e8.m_data.m_data[1].m_data[1] = sy.m_data[1] * -0.5;
    local_e8.m_data.m_data[1].m_data[0] = sy.m_data[1] * -0.5;
    local_e8.m_data.m_data[1].m_data._8_8_ = (ulong)(uint)(pTVar2->maxDY).m_data[1] << 0x20;
    local_e8.m_data.m_data[2].m_data[1] = sy.m_data[2] * -0.5;
    local_e8.m_data.m_data[2].m_data[0] = sy.m_data[2] * -0.5;
    local_e8.m_data.m_data[2].m_data._8_8_ = (ulong)(uint)(pTVar2->maxDY).m_data[2] << 0x20;
    local_e8.m_data.m_data[3].m_data[0] = 0.0;
    local_e8.m_data.m_data[3].m_data[1] = 0.0;
    local_e8.m_data.m_data[3].m_data[2] = 0.0;
    local_e8.m_data.m_data[3].m_data[3] = 0.0;
    pfVar4 = s.m_data;
    s.m_data[0] = 0.0;
    s.m_data[1] = 0.0;
    s.m_data[2] = 0.0;
    s.m_data[3] = 0.0;
    do {
      lVar6 = 0;
      do {
        pfVar4[lVar6] = (float)*(undefined4 *)((long)pfVar3 + lVar6);
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0x10);
      lVar5 = lVar5 + 1;
      pfVar3 = pfVar3 + 4;
      pfVar4 = pfVar4 + 1;
    } while (lVar5 != 4);
    pfVar4 = s.m_data;
    std::vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>>::
    emplace_back<tcu::Matrix<float,4,4>>
              ((vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>> *)this_00,
               (Matrix<float,_4,_4> *)pfVar4);
    s.m_data[0] = 0.0;
    s.m_data[1] = 0.0;
    s.m_data[2] = 0.0;
    s.m_data[3] = 0.0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        pfVar4[lVar6] =
             *(float *)((long)((Vector<tcu::Vector<float,_4>,_4> *)__args->m_data)->m_data[0].m_data
                       + lVar6);
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0x10);
      lVar5 = lVar5 + 1;
      __args = __args + 1;
      pfVar4 = pfVar4 + 1;
    } while (lVar5 != 4);
    std::vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>>::
    emplace_back<tcu::Matrix<float,4,4>>
              ((vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>> *)this_00,
               (Matrix<float,_4,_4> *)&s);
    ShaderRenderCaseInstance::useAttribute(&this->super_ShaderRenderCaseInstance,5,A_IN1);
    ShaderRenderCaseInstance::useAttribute(&this->super_ShaderRenderCaseInstance,6,A_IN2);
  }
  initTexture(this);
  return;
}

Assistant:

ShaderTextureFunctionInstance::ShaderTextureFunctionInstance (Context&						context,
															  const bool					isVertexCase,
															  const ShaderEvaluator&		evaluator,
															  const UniformSetup&			uniformSetup,
															  const TextureLookupSpec&		lookupSpec,
															  const TextureSpec&			textureSpec,
															  const TexLookupParams&		lookupParams,
															  const ImageBackingMode		imageBackingMode)
	: ShaderRenderCaseInstance	(context, isVertexCase, evaluator, uniformSetup, DE_NULL, imageBackingMode)
	, m_lookupSpec				(lookupSpec)
	, m_textureSpec				(textureSpec)
	, m_lookupParams			(lookupParams)
{
	checkDeviceFeatures(m_context, m_textureSpec.type);

	{
		// Base coord scale & bias
		Vec4 s = m_lookupSpec.maxCoord-m_lookupSpec.minCoord;
		Vec4 b = m_lookupSpec.minCoord;

		float baseCoordTrans[] =
		{
			s.x(),		0.0f,		0.f,	b.x(),
			0.f,		s.y(),		0.f,	b.y(),
			s.z()/2.f,	-s.z()/2.f,	0.f,	s.z()/2.f + b.z(),
			-s.w()/2.f,	s.w()/2.f,	0.f,	s.w()/2.f + b.w()
		};

		m_userAttribTransforms.push_back(tcu::Mat4(baseCoordTrans));

		useAttribute(4u, A_IN0);
	}

	bool hasLodBias	= functionHasLod(m_lookupSpec.function) || m_lookupSpec.useBias;
	bool isGrad		= functionHasGrad(m_lookupSpec.function);
	DE_ASSERT(!isGrad || !hasLodBias);

	if (hasLodBias)
	{
		float s = m_lookupSpec.maxLodBias-m_lookupSpec.minLodBias;
		float b = m_lookupSpec.minLodBias;
		float lodCoordTrans[] =
		{
			s/2.0f,		s/2.0f,		0.f,	b,
			0.0f,		0.0f,		0.0f,	0.0f,
			0.0f,		0.0f,		0.0f,	0.0f,
			0.0f,		0.0f,		0.0f,	0.0f
		};

		m_userAttribTransforms.push_back(tcu::Mat4(lodCoordTrans));

		useAttribute(5u, A_IN1);
	}
	else if (isGrad)
	{
		Vec3 sx = m_lookupSpec.maxDX-m_lookupSpec.minDX;
		Vec3 sy = m_lookupSpec.maxDY-m_lookupSpec.minDY;
		float gradDxTrans[] =
		{
			sx.x()/2.0f,	sx.x()/2.0f,	0.f,	m_lookupSpec.minDX.x(),
			sx.y()/2.0f,	sx.y()/2.0f,	0.0f,	m_lookupSpec.minDX.y(),
			sx.z()/2.0f,	sx.z()/2.0f,	0.0f,	m_lookupSpec.minDX.z(),
			0.0f,			0.0f,			0.0f,	0.0f
		};
		float gradDyTrans[] =
		{
			-sy.x()/2.0f,	-sy.x()/2.0f,	0.f,	m_lookupSpec.maxDY.x(),
			-sy.y()/2.0f,	-sy.y()/2.0f,	0.0f,	m_lookupSpec.maxDY.y(),
			-sy.z()/2.0f,	-sy.z()/2.0f,	0.0f,	m_lookupSpec.maxDY.z(),
			0.0f,			0.0f,			0.0f,	0.0f
		};

		m_userAttribTransforms.push_back(tcu::Mat4(gradDxTrans));
		m_userAttribTransforms.push_back(tcu::Mat4(gradDyTrans));

		useAttribute(5u, A_IN1);
		useAttribute(6u, A_IN2);
	}

	initTexture();
}